

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj_test.c
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  
  _mpp_log_l(4,"kmpp_obj_test","start\n",0);
  lVar3 = 0x10;
  do {
    uVar1 = *(undefined8 *)((long)&__frame_dummy_init_array_entry + lVar3);
    iVar2 = (**(code **)((long)&obj_tests[0].name + lVar3))(uVar1,0);
    if (iVar2 != 0) {
      _mpp_log_l(4,"kmpp_obj_test","test %-16s failed ret %d\n",0,uVar1,iVar2);
      pcVar4 = "failed";
      goto LAB_001012e1;
    }
    _mpp_log_l(4,"kmpp_obj_test","test %-16s success\n",0,uVar1);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x58);
  pcVar4 = "success";
LAB_001012e1:
  _mpp_log_l(4,"kmpp_obj_test","done %s \n",0,pcVar4);
  return iVar2;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_NOK;
    rk_u32 i;

    mpp_log("start\n");

    for (i = 0; i < MPP_ARRAY_ELEMS(obj_tests); i++) {
        const char *name = obj_tests[i].name;
        rk_u32 flag = obj_tests[i].flag;

        ret = obj_tests[i].func(name, flag);
        if (ret) {
            mpp_log("test %-16s failed ret %d\n", name, ret);
            goto done;
        }
        mpp_log("test %-16s success\n", name);
    }

done:
    mpp_log("done %s \n", ret ? "failed" : "success");

    return ret;
}